

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O3

void __thiscall
wasm::FunctionValidator::validateCallParamsAndResult<wasm::Call>
          (FunctionValidator *this,Call *curr,HeapType sigType,Expression *printable)

{
  size_t sVar1;
  Type TVar2;
  bool bVar3;
  size_t sVar4;
  Type *pTVar5;
  Type *pTVar6;
  ostringstream *poVar7;
  ostream *poVar8;
  ulong uVar9;
  Signature SVar10;
  HeapType local_60;
  HeapType sigType_local;
  Signature sig;
  Iterator __begin2;
  
  local_60.id = sigType.id;
  bVar3 = HeapType::isSignature(&local_60);
  bVar3 = ValidationInfo::shouldBeTrue<wasm::Expression*>
                    (this->info,bVar3,printable,"Heap type must be a signature type",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if (bVar3) {
    _sigType_local = HeapType::getSignature(&local_60);
    sVar1 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    sVar4 = wasm::Type::size((Type *)&sigType_local);
    bVar3 = ValidationInfo::shouldBeTrue<wasm::Expression*>
                      (this->info,sVar1 == sVar4,printable,"call* param number must match",
                       (this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currFunction);
    if (bVar3) {
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)0x0;
      sig.results.id = (uintptr_t)&sigType_local;
      pTVar5 = (Type *)wasm::Type::size((Type *)&sigType_local);
      if (pTVar5 != (Type *)0x0) {
        uVar9 = 0;
        do {
          pTVar6 = wasm::Type::Iterator::operator*((Iterator *)&sig.results);
          if ((curr->operands).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
              usedElements <= uVar9) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          bVar3 = shouldBeSubType(this,(Type)((curr->operands).
                                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                              .data[uVar9]->type).id,(Type)pTVar6->id,printable,
                                  "call param types must match");
          if ((!bVar3) && (this->info->quiet == false)) {
            poVar7 = ValidationInfo::getStream_abi_cxx11_
                               (this->info,
                                (this->
                                super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                                ).
                                super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .
                                super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                                .currFunction);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar7,"(on argument ",0xd);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,")\n",2);
          }
          uVar9 = uVar9 + 1;
          __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
               (Type *)((long)&(__begin2.
                                super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                               parent)->id + 1);
        } while ((__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                  parent != pTVar5) || ((HeapType *)sig.results.id != &sigType_local));
      }
      TVar2.id = (curr->super_SpecificExpression<(wasm::Expression::Id)6>).super_Expression.type.id;
      if (curr->isReturn == false) {
        ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::Expression*,wasm::Type>
                  (this->info,TVar2,sig.params,printable,"call* type must match callee return type",
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                   ).
                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .
                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .currFunction);
      }
      else {
        ValidationInfo::shouldBeEqual<wasm::Expression*,wasm::Type>
                  (this->info,TVar2,(Type)0x1,printable,"return_call* should have unreachable type",
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                   ).
                   super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .
                   super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                   .currFunction);
        TVar2.id = sig.params.id;
        SVar10 = HeapType::getSignature
                           (&((this->
                              super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                              ).
                              super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                              .
                              super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                             .currFunction)->type);
        shouldBeSubType(this,TVar2,SVar10.results.id,printable,
                        "return_call* callee return type must match caller return type");
      }
    }
  }
  return;
}

Assistant:

void validateCallParamsAndResult(T* curr,
                                   HeapType sigType,
                                   Expression* printable) {
    if (!shouldBeTrue(sigType.isSignature(),
                      printable,
                      "Heap type must be a signature type")) {
      return;
    }
    auto sig = sigType.getSignature();
    if (!shouldBeTrue(curr->operands.size() == sig.params.size(),
                      printable,
                      "call* param number must match")) {
      return;
    }
    size_t i = 0;
    for (const auto& param : sig.params) {
      if (!shouldBeSubType(curr->operands[i]->type,
                           param,
                           printable,
                           "call param types must match") &&
          !info.quiet) {
        getStream() << "(on argument " << i << ")\n";
      }
      ++i;
    }
    if (curr->isReturn) {
      shouldBeEqual(curr->type,
                    Type(Type::unreachable),
                    printable,
                    "return_call* should have unreachable type");
      shouldBeSubType(
        sig.results,
        getFunction()->getResults(),
        printable,
        "return_call* callee return type must match caller return type");
    } else {
      shouldBeEqualOrFirstIsUnreachable(
        curr->type,
        sig.results,
        printable,
        "call* type must match callee return type");
    }
  }